

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O3

void __thiscall
xLearn::FMScore::calc_grad_ftrl(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  undefined8 uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  undefined4 *puVar14;
  int iVar15;
  long lVar16;
  pointer pfVar17;
  int iVar18;
  ulong uVar19;
  Model *pMVar20;
  float fVar21;
  float fVar22;
  float fVar25;
  undefined1 auVar26 [16];
  float fVar23;
  undefined1 auVar27 [16];
  float fVar24;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  real_t rVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM6 [64];
  vector<float,_std::allocator<float>_> sv;
  allocator_type local_109;
  SparseRow *local_108;
  real_t local_fc;
  undefined1 local_f8 [16];
  Model *local_e0;
  undefined4 *local_d8;
  int local_cc;
  undefined1 local_c8 [16];
  long local_b8;
  pointer local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 *local_98;
  value_type_conflict1 local_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  real_t local_78;
  real_t rStack_74;
  real_t rStack_70;
  real_t rStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  vector<float,_std::allocator<float>_> local_48;
  
  auVar35._4_60_ = in_register_00001244;
  auVar35._0_4_ = norm;
  local_108 = row;
  local_fc = norm;
  if (norm < 0.0) {
    fVar24 = sqrtf(norm);
  }
  else {
    auVar26 = vsqrtss_avx(auVar35._0_16_,auVar35._0_16_);
    fVar24 = auVar26._0_4_;
  }
  auVar26 = in_ZMM6._0_16_;
  uVar3 = *(uint *)(model + 0x48);
  lVar16 = *(long *)local_108;
  lVar13 = *(long *)(local_108 + 8);
  local_e0 = model;
  if (lVar16 != lVar13) {
    lVar6 = *(long *)(model + 0x58);
    do {
      uVar4 = *(uint *)(lVar16 + 4);
      if (uVar4 < uVar3) {
        uVar19 = (ulong)(uVar4 * 3);
        uVar12 = (ulong)(uVar4 * 3 + 1);
        fVar23 = *(float *)(lVar6 + uVar12 * 4);
        auVar28 = vfmadd231ss_fma(ZEXT416((uint)(pg * *(float *)(lVar16 + 8) * fVar24)),
                                  ZEXT416((uint)(this->super_Score).lambda_2_),
                                  ZEXT416(*(uint *)(lVar6 + uVar19 * 4)));
        auVar26 = vfmadd213ss_fma(auVar28,auVar28,ZEXT416((uint)fVar23));
        fVar21 = auVar26._0_4_;
        *(float *)(lVar6 + uVar12 * 4) = fVar21;
        if (fVar21 < 0.0) {
          local_f8._0_4_ = fVar23;
          fVar21 = sqrtf(fVar21);
          fVar23 = (float)local_f8._0_4_;
        }
        else {
          auVar26 = vsqrtss_avx(auVar26,auVar26);
          fVar21 = auVar26._0_4_;
        }
        if (fVar23 < 0.0) {
          local_f8._0_4_ = fVar21;
          fVar23 = sqrtf(fVar23);
          fVar21 = (float)local_f8._0_4_;
        }
        else {
          auVar26 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
          fVar23 = auVar26._0_4_;
        }
        auVar26._0_4_ = (fVar21 - fVar23) / (this->super_Score).alpha_;
        auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
        uVar11 = (ulong)(uVar4 * 3 + 2);
        auVar26 = vfnmadd231ss_fma(ZEXT416(auVar28._0_4_),auVar26,
                                   ZEXT416(*(uint *)(lVar6 + uVar19 * 4)));
        fVar21 = auVar26._0_4_ + *(float *)(lVar6 + uVar11 * 4);
        auVar28 = ZEXT816(0);
        uVar8 = vcmpss_avx512f(auVar28,ZEXT416((uint)fVar21),1);
        bVar9 = (bool)((byte)uVar8 & 1);
        *(float *)(lVar6 + uVar11 * 4) = fVar21;
        fVar23 = (this->super_Score).lambda_1_;
        fVar25 = (float)((uint)bVar9 * 0x3f800000 + (uint)!bVar9 * -0x40800000);
        if (fVar23 < fVar21 * fVar25) {
          fVar22 = *(float *)(lVar6 + uVar12 * 4);
          rVar31 = (this->super_Score).beta_;
          if (fVar22 < 0.0) {
            local_f8._0_4_ = fVar23;
            local_c8 = ZEXT416((uint)fVar25);
            local_d8 = (undefined4 *)CONCAT44(local_d8._4_4_,rVar31);
            fVar22 = sqrtf(fVar22);
            rVar31 = local_d8._0_4_;
            fVar23 = (float)local_f8._0_4_;
            auVar26 = local_c8;
          }
          else {
            auVar26 = vsqrtss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22));
            fVar22 = auVar26._0_4_;
            auVar26 = ZEXT416((uint)fVar25);
          }
          auVar26 = vfmsub213ss_fma(ZEXT416((uint)fVar23),auVar26,ZEXT416((uint)fVar21));
          auVar28._0_4_ =
               auVar26._0_4_ /
               ((rVar31 + fVar22) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
          auVar28._4_12_ = auVar26._4_12_;
        }
        *(int *)(lVar6 + uVar19 * 4) = auVar28._0_4_;
        lVar13 = *(long *)(local_108 + 8);
      }
      auVar26 = in_ZMM6._0_16_;
      lVar16 = lVar16 + 0xc;
    } while (lVar16 != lVar13);
  }
  pMVar20 = local_e0;
  puVar7 = *(uint **)(local_e0 + 0x68);
  fVar24 = (float)puVar7[1];
  auVar28 = vfmadd213ss_fma(ZEXT416((uint)pg),ZEXT416((uint)pg),ZEXT416((uint)fVar24));
  fVar23 = auVar28._0_4_;
  puVar7[1] = (uint)fVar23;
  if (fVar23 < 0.0) {
    fVar23 = sqrtf(fVar23);
  }
  else {
    auVar28 = vsqrtss_avx(auVar28,auVar28);
    fVar23 = auVar28._0_4_;
  }
  if (fVar24 < 0.0) {
    fVar24 = sqrtf(fVar24);
  }
  else {
    auVar28 = vsqrtss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
    fVar24 = auVar28._0_4_;
  }
  auVar27._0_4_ = (fVar23 - fVar24) / (this->super_Score).alpha_;
  auVar27._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar28 = vfnmadd132ss_fma(auVar27,ZEXT416((uint)pg),ZEXT416(*puVar7));
  auVar32._0_12_ = ZEXT812(0);
  auVar32._12_4_ = 0;
  fVar23 = auVar28._0_4_ + (float)puVar7[2];
  uVar8 = vcmpss_avx512f(auVar32,ZEXT416((uint)fVar23),1);
  bVar9 = (bool)((byte)uVar8 & 1);
  puVar7[2] = (uint)fVar23;
  fVar24 = (this->super_Score).lambda_1_;
  fVar21 = (float)((uint)bVar9 * 0x3f800000 + (uint)!bVar9 * -0x40800000);
  if (fVar24 < fVar23 * fVar21) {
    auVar28 = vfmsub213ss_fma(ZEXT416((uint)fVar24),ZEXT416((uint)fVar21),ZEXT416((uint)fVar23));
    fVar24 = (float)puVar7[1];
    fVar23 = (this->super_Score).beta_;
    if (fVar24 < 0.0) {
      fVar24 = sqrtf(fVar24);
      auVar28 = ZEXT416(auVar28._0_4_);
    }
    else {
      auVar27 = vsqrtss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
      fVar24 = auVar27._0_4_;
    }
    auVar32._0_4_ =
         auVar28._0_4_ /
         ((fVar23 + fVar24) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
    auVar32._4_12_ = auVar28._4_12_;
  }
  *puVar7 = auVar32._0_4_;
  auVar28 = vcvtusi2ss_avx512f(auVar26,*(undefined4 *)(pMVar20 + 0x50));
  rVar31 = (this->super_Score).lambda_2_;
  local_88._4_4_ = rVar31;
  local_88._0_4_ = rVar31;
  fStack_80 = rVar31;
  fStack_7c = rVar31;
  auVar28 = ZEXT416((uint)(auVar28._0_4_ * 0.25));
  auVar28 = vroundss_avx(auVar28,auVar28,10);
  iVar15 = vcvttss2usi_avx512f(auVar28);
  local_78 = (this->super_Score).alpha_;
  uVar4 = iVar15 * 4;
  uVar19 = (ulong)uVar4;
  auVar28 = vcvtusi2ss_avx512f(auVar26,*(undefined4 *)(pMVar20 + 0x54));
  local_8c = 0.0;
  rStack_74 = local_78;
  rStack_70 = local_78;
  rStack_6c = local_78;
  std::vector<float,_std::allocator<float>_>::vector(&local_48,uVar19,&local_8c,&local_109);
  lVar16 = *(long *)local_108;
  lVar13 = *(long *)(local_108 + 8);
  if (lVar16 != lVar13) {
    auVar26 = vcvtusi2ss_avx512f(auVar26,uVar4);
    iVar18 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar26._0_4_ * auVar28._0_4_)));
    do {
      uVar5 = *(uint *)(lVar16 + 4);
      if ((uVar5 < uVar3) && (uVar19 != 0)) {
        fVar24 = local_fc * *(float *)(lVar16 + 8);
        uVar12 = 0;
        lVar13 = *(long *)(pMVar20 + 0x60);
        do {
          pfVar1 = (float *)((ulong)(uVar5 * iVar18) * 4 + lVar13 + uVar12 * 4);
          pfVar2 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar12;
          auVar33._0_4_ = fVar24 * *pfVar1 + *pfVar2;
          auVar33._4_4_ = fVar24 * pfVar1[1] + pfVar2[1];
          auVar33._8_4_ = fVar24 * pfVar1[2] + pfVar2[2];
          auVar33._12_4_ = fVar24 * pfVar1[3] + pfVar2[3];
          *(undefined1 (*) [16])
           (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start + uVar12) = auVar33;
          uVar12 = uVar12 + 4;
        } while (uVar12 < uVar19);
        lVar13 = *(long *)(local_108 + 8);
      }
      lVar16 = lVar16 + 0xc;
    } while (lVar16 != lVar13);
    lVar16 = *(long *)local_108;
    if (lVar16 != lVar13) {
      local_b0 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pfVar17 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      rVar31 = local_fc;
      local_cc = iVar18;
      do {
        if ((*(uint *)(lVar16 + 4) < uVar3) && (uVar4 != 0)) {
          local_58 = rVar31 * *(float *)(lVar16 + 8);
          uVar12 = 0;
          puVar14 = (undefined4 *)
                    ((ulong)(*(uint *)(lVar16 + 4) * iVar18) * 4 + *(long *)(pMVar20 + 0x60));
          local_a0 = puVar14 + uVar19;
          local_68 = local_58 * pg;
          local_a8 = puVar14 + (uint)(iVar15 << 3);
          local_b8 = lVar16;
          local_98 = puVar14;
          fStack_64 = local_68;
          fStack_60 = local_68;
          fStack_5c = local_68;
          fStack_54 = local_58;
          fStack_50 = local_58;
          fStack_4c = local_58;
          do {
            lVar16 = 4;
            pfVar1 = (float *)(local_98 + uVar12);
            fVar24 = *pfVar1;
            fVar23 = pfVar1[1];
            fVar21 = pfVar1[2];
            fVar25 = pfVar1[3];
            auVar37._0_4_ = fVar24 * local_58;
            auVar37._4_4_ = fVar23 * fStack_54;
            auVar37._8_4_ = fVar21 * fStack_50;
            auVar37._12_4_ = fVar25 * fStack_4c;
            auVar26 = *(undefined1 (*) [16])(local_a0 + uVar12);
            auVar28 = vsubps_avx(*(undefined1 (*) [16])(pfVar17 + uVar12),auVar37);
            auVar29._0_4_ = fVar24 * (float)local_88._0_4_ + auVar28._0_4_ * local_68;
            auVar29._4_4_ = fVar23 * (float)local_88._4_4_ + auVar28._4_4_ * fStack_64;
            auVar29._8_4_ = fVar21 * fStack_80 + auVar28._8_4_ * fStack_60;
            auVar29._12_4_ = fVar25 * fStack_7c + auVar28._12_4_ * fStack_5c;
            auVar36._0_4_ = auVar26._0_4_ + auVar29._0_4_ * auVar29._0_4_;
            auVar36._4_4_ = auVar26._4_4_ + auVar29._4_4_ * auVar29._4_4_;
            auVar36._8_4_ = auVar26._8_4_ + auVar29._8_4_ * auVar29._8_4_;
            auVar36._12_4_ = auVar26._12_4_ + auVar29._12_4_ * auVar29._12_4_;
            auVar26 = vsqrtps_avx(auVar26);
            auVar28 = vsqrtps_avx(auVar36);
            auVar26 = vsubps_avx(auVar28,auVar26);
            auVar10._4_4_ = rStack_74;
            auVar10._0_4_ = local_78;
            auVar10._8_4_ = rStack_70;
            auVar10._12_4_ = rStack_6c;
            auVar26 = vdivps_avx(auVar26,auVar10);
            auVar34._0_4_ = fVar24 * auVar26._0_4_;
            auVar34._4_4_ = fVar23 * auVar26._4_4_;
            auVar34._8_4_ = fVar21 * auVar26._8_4_;
            auVar34._12_4_ = fVar25 * auVar26._12_4_;
            auVar26 = vsubps_avx(auVar29,auVar34);
            pfVar1 = (float *)(local_a8 + uVar12);
            fVar24 = pfVar1[1];
            fVar23 = pfVar1[2];
            fVar21 = pfVar1[3];
            pfVar2 = (float *)(local_a8 + uVar12);
            *pfVar2 = auVar26._0_4_ + *pfVar1;
            pfVar2[1] = auVar26._4_4_ + fVar24;
            pfVar2[2] = auVar26._8_4_ + fVar23;
            pfVar2[3] = auVar26._12_4_ + fVar21;
            *(undefined1 (*) [16])(local_a0 + uVar12) = auVar36;
            local_d8 = puVar14;
            do {
              fVar24 = (float)puVar14[(uint)(iVar15 << 3)];
              auVar30 = ZEXT816(0) << 0x40;
              fVar23 = (this->super_Score).lambda_1_;
              uVar8 = vcmpss_avx512f(auVar30,ZEXT416((uint)fVar24),1);
              bVar9 = (bool)((byte)uVar8 & 1);
              fVar21 = (float)((uint)bVar9 * 0x3f800000 + (uint)!bVar9 * -0x40800000);
              if (fVar23 < fVar24 * fVar21) {
                fVar25 = (float)puVar14[uVar19];
                fVar22 = (this->super_Score).beta_;
                if (fVar25 < 0.0) {
                  local_f8 = ZEXT416((uint)fVar21);
                  local_c8._0_4_ = fVar22;
                  fVar25 = sqrtf(fVar25);
                  fVar22 = (float)local_c8._0_4_;
                  auVar26 = local_f8;
                }
                else {
                  auVar26 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
                  fVar25 = auVar26._0_4_;
                  auVar26 = ZEXT416((uint)fVar21);
                }
                auVar26 = vfmsub213ss_fma(ZEXT416((uint)fVar23),auVar26,ZEXT416((uint)fVar24));
                auVar30._0_4_ =
                     auVar26._0_4_ /
                     ((fVar22 + fVar25) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_
                     );
                auVar30._4_12_ = auVar26._4_12_;
              }
              *puVar14 = auVar30._0_4_;
              puVar14 = puVar14 + 1;
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
            uVar12 = uVar12 + 4;
            puVar14 = local_d8 + 4;
            pfVar17 = local_b0;
          } while (uVar12 < uVar19);
          lVar13 = *(long *)(local_108 + 8);
          lVar16 = local_b8;
          pMVar20 = local_e0;
          iVar18 = local_cc;
          rVar31 = local_fc;
        }
        lVar16 = lVar16 + 0xc;
      } while (lVar16 != lVar13);
    }
  }
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FMScore::calc_grad_ftrl(const SparseRow* row,
                             Model& model,
                             real_t pg,
                             real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }  
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t aligned_k = model.get_aligned_k();
  index_t align0 = model.get_aligned_k() * 
                   model.GetAuxiliarySize();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMalpha = _mm_set1_ps(alpha_);
  __m128 XMML2 = _mm_set1_ps(lambda_2_);
  std::vector<real_t> sv(aligned_k, 0);
  real_t* s = sv.data();
 for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 const XMMw = _mm_load_ps(w+d);
      XMMs = _mm_add_ps(XMMs, _mm_mul_ps(XMMw, XMMv));
      _mm_store_ps(s+d, XMMs);
    }
  }
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t j1 = iter->feat_id;
    // To avoid unseen feature
    if (j1 >= num_feat) continue;
    real_t v1 = iter->feat_val;
    real_t *w_base = model.GetParameter_v() + j1 * align0;
    __m128 XMMv = _mm_set1_ps(v1*norm);
    __m128 XMMpgv = _mm_mul_ps(XMMpg, XMMv);
    for (index_t d = 0; d < aligned_k; d += kAlign) {
      real_t* w = w_base + d;
      real_t* wg = w_base + aligned_k + d;
      real_t* z = w_base + aligned_k*2 + d;
      __m128 XMMs = _mm_load_ps(s+d);
      __m128 XMMw = _mm_load_ps(w);
      __m128 XMMwg = _mm_load_ps(wg);
      __m128 XMMz = _mm_load_ps(z);
      __m128 XMMg = _mm_add_ps(
                    _mm_mul_ps(XMML2, XMMw),
                    _mm_mul_ps(XMMpgv,
                    _mm_sub_ps(XMMs,
                      _mm_mul_ps(XMMw, XMMv))));
      __m128 XMMsigma = _mm_div_ps(
                        _mm_sub_ps(
                        _mm_sqrt_ps(
                        _mm_add_ps(XMMwg,
                        _mm_mul_ps(XMMg, XMMg))),
                        _mm_sqrt_ps(XMMwg)), XMMalpha);
      XMMz = _mm_add_ps(XMMz,
             _mm_sub_ps(XMMg,
             _mm_mul_ps(XMMsigma, XMMw)));
      _mm_store_ps(z, XMMz);
      XMMwg = _mm_add_ps(XMMwg,
              _mm_mul_ps(XMMg, XMMg));
      _mm_store_ps(wg, XMMwg);
      // Update w. SSE mat not faster.
      for (size_t i = 0; i < kAlign; ++i) {
        real_t z_value = *(z+i);
        int sign = z_value > 0 ? 1:-1;
        if (sign * z_value <= lambda_1_) {
          *(w+i) = 0;
        } else {
          *(w+i) = (sign*lambda_1_-z_value) / 
              ((beta_ + sqrt(*(wg+i))) / alpha_ + lambda_2_);
        }
      }
    }
  }
}